

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::TaskSet::add(TaskSet *this,Promise<void> *promise)

{
  Task *pTVar1;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *other;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> task;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> local_20;
  PromiseBase local_18;
  
  local_18.node.ptr = (OwnPromiseNode)(promise->super_PromiseBase).node.ptr;
  (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  kj::_::PromiseDisposer::appendPromise<kj::TaskSet::Task,kj::_::PromiseDisposer,kj::TaskSet&>
            ((PromiseDisposer *)&local_20,&local_18.node,this);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_18.node);
  pTVar1 = (this->tasks).ptr.ptr;
  other = &this->tasks;
  if (pTVar1 != (Task *)0x0) {
    pTVar1->prev = &(local_20.ptr)->next;
    Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::operator=
              (&((local_20.ptr)->next).ptr,&other->ptr);
  }
  (local_20.ptr)->prev = other;
  local_18.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_20.ptr;
  local_20.ptr = (Task *)0x0;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::operator=
            (&other->ptr,(Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *)&local_18);
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *)&local_18);
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::dispose(&local_20);
  return;
}

Assistant:

void TaskSet::add(Promise<void>&& promise) {
  auto task = _::PromiseDisposer::appendPromise<Task>(_::PromiseNode::from(kj::mv(promise)), *this);
  KJ_IF_SOME(head, tasks) {
    head->prev = &task->next;
    task->next = kj::mv(tasks);
  }
  task->prev = &tasks;
  tasks = kj::mv(task);
}